

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginListBox(char *label,ImVec2 *size_arg)

{
  float fVar1;
  ImVec2 size_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id_00;
  ImGuiWindow *pIVar4;
  float fVar5;
  float fVar6;
  float local_fc;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 label_pos;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined1 local_90 [8];
  ImRect bb;
  undefined1 local_78 [8];
  ImRect frame_bb;
  ImVec2 frame_size;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *size_arg_local;
  char *label_local;
  
  pIVar2 = GImGui;
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    id_00 = GetID(label);
    size = CalcTextSize(label,(char *)0x0,true,-1.0);
    size_00 = *size_arg;
    fVar5 = CalcItemWidth();
    fVar6 = GetTextLineHeightWithSpacing();
    fVar1 = (pIVar2->Style).FramePadding.y;
    local_54 = CalcItemSize(size_00,fVar5,fVar6 * 7.25 + fVar1 + fVar1);
    local_4c = ImFloor(&local_54);
    fVar1 = local_4c.x;
    fVar5 = ImMax<float>(local_4c.y,size.y);
    ImVec2::ImVec2(&frame_bb.Max,fVar1,fVar5);
    bb.Max = operator+(&(pIVar4->DC).CursorPos,&frame_bb.Max);
    ImRect::ImRect((ImRect *)local_78,&(pIVar4->DC).CursorPos,&bb.Max);
    if (size.x <= 0.0) {
      local_fc = 0.0;
    }
    else {
      local_fc = (pIVar2->Style).ItemInnerSpacing.x + size.x;
    }
    ImVec2::ImVec2(&local_a0,local_fc,0.0);
    local_98 = operator+(&frame_bb.Min,&local_a0);
    ImRect::ImRect((ImRect *)local_90,(ImVec2 *)local_78,&local_98);
    ImGuiNextItemData::ClearFlags(&pIVar2->NextItemData);
    bVar3 = IsRectVisible((ImVec2 *)local_90,&bb.Min);
    if (bVar3) {
      BeginGroup();
      if (0.0 < size.x) {
        ImVec2::ImVec2(&local_b0,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                       (float)local_78._4_4_ + (pIVar2->Style).FramePadding.y);
        local_b8 = local_b0;
        RenderText(local_b0,label,(char *)0x0,true);
        local_c8 = operator+(&local_b0,&size);
        local_c0 = ImMax(&(pIVar4->DC).CursorMaxPos,&local_c8);
        (pIVar4->DC).CursorMaxPos = local_c0;
      }
      local_d0 = ImRect::GetSize((ImRect *)local_78);
      BeginChildFrame(id_00,&local_d0,0);
      label_local._7_1_ = true;
    }
    else {
      label_pos = ImRect::GetSize((ImRect *)local_90);
      ItemSize(&label_pos,(pIVar2->Style).FramePadding.y);
      ItemAdd((ImRect *)local_90,0,(ImRect *)local_78,0);
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginListBox(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7.25 items.
    // Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = ImFloor(CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.25f + style.FramePadding.y * 2.0f));
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    // FIXME-OPT: We could omit the BeginGroup() if label_size.x but would need to omit the EndGroup() as well.
    BeginGroup();
    if (label_size.x > 0.0f)
    {
        ImVec2 label_pos = ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y);
        RenderText(label_pos, label);
        window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, label_pos + label_size);
    }

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}